

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::NotEnoughArguments::~NotEnoughArguments(NotEnoughArguments *this)

{
  NotEnoughArguments *this_local;
  
  ~NotEnoughArguments(this);
  operator_delete(this);
  return;
}

Assistant:

class CAMP_API NotEnoughArguments : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param functionName Name of the function
     * \param provided Number of arguments provided
     * \param expected Number of arguments expected
     */
    NotEnoughArguments(const std::string& functionName, std::size_t provided, std::size_t expected);
}